

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * ghc::filesystem::read_symlink(path *__return_storage_ptr__,path *p,error_code *ec)

{
  bool bVar1;
  file_type fVar2;
  error_code eVar3;
  undefined1 local_60 [8];
  path result;
  undefined4 uStack_34;
  file_status local_28;
  file_status fs;
  error_code *ec_local;
  path *p_local;
  
  fs = (file_status)ec;
  symlink_status((filesystem *)&local_28,p,ec);
  fVar2 = file_status::type(&local_28);
  if (fVar2 == symlink) {
    detail::resolveSymlink((path *)local_60,p,(error_code *)fs);
    bVar1 = std::error_code::operator_cast_to_bool((error_code *)fs);
    if (bVar1) {
      path::path(__return_storage_ptr__);
    }
    else {
      path::path(__return_storage_ptr__,(path *)local_60);
    }
    result._path.field_2._12_4_ = 1;
    path::~path((path *)local_60);
  }
  else {
    eVar3 = detail::make_error_code(invalid_argument);
    *(ulong *)fs = CONCAT44(uStack_34,eVar3._M_value);
    *(error_category **)((long)fs + 8) = eVar3._M_cat;
    path::path(__return_storage_ptr__);
    result._path.field_2._12_4_ = 1;
  }
  file_status::~file_status(&local_28);
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path read_symlink(const path& p, std::error_code& ec)
{
    file_status fs = symlink_status(p, ec);
    if (fs.type() != file_type::symlink) {
        ec = detail::make_error_code(detail::portable_error::invalid_argument);
        return path();
    }
    auto result = detail::resolveSymlink(p, ec);
    return ec ? path() : result;
}